

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::InternalClose(ScriptContext *this)

{
  Type_conflict pSVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  CriticalSection *cs;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar6;
  size_t deadCode;
  JITManager *this_00;
  ProbeContainer *pPVar7;
  DynamicSourceContextInfoMap *pDVar8;
  char16 *url;
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  ArenaAllocator *pAVar9;
  Type_conflict *ppSVar10;
  long *plVar11;
  long extraout_RDX;
  code *local_c0;
  AutoCriticalSection local_70;
  AutoCriticalSection autoDebugContextCloseCS;
  byte local_55 [8];
  bool hasFunctions;
  AutoCriticalSection local_48;
  AutoCriticalSection autocs;
  ScriptContext *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  this->isScriptContextActuallyClosed = true;
  autocs.cs = (CriticalSection *)this;
  pTVar4 = GetThreadContext(this);
  pTVar4->closedScriptContextCount = pTVar4->closedScriptContextCount + 1;
  if ((DAT_01ec73c4 & 1) != 0) {
    Output::Print(L"MemoryTrace: ScriptContext Close\n");
    Output::Flush();
  }
  if (this->TTDWellKnownInfo != (RuntimeContextInfo *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::RuntimeContextInfo>
              (&Memory::HeapAllocator::Instance,this->TTDWellKnownInfo);
    this->TTDWellKnownInfo = (RuntimeContextInfo *)0x0;
  }
  if (this->TTDContextInfo != (ScriptContextTTD *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::ScriptContextTTD>
              (&Memory::HeapAllocator::Instance,this->TTDContextInfo);
    this->TTDContextInfo = (ScriptContextTTD *)0x0;
  }
  if (this->nativeCodeGen != (NativeCodeGenerator *)0x0) {
    if (((this->isInitialized & 1U) != 0) &&
       ((this->super_ScriptContextBase).globalObject == (GlobalObject *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x289,"(!isInitialized || this->globalObject != nullptr)",
                                  "!isInitialized || this->globalObject != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    CloseNativeCodeGenerator(this->nativeCodeGen);
  }
  pTVar4 = GetThreadContext(this);
  cs = ThreadContext::GetFunctionBodyLock(pTVar4);
  AutoCriticalSection::AutoCriticalSection(&local_48,cs);
  pLVar6 = Memory::RecyclerRootPtr::operator_cast_to_List_((RecyclerRootPtr *)&this->sourceList);
  if (pLVar6 != (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                 *)0x0) {
    local_55[0] = 0;
    pLVar6 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->sourceList);
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::FreeListedRemovePolicy,DefaultComparer>
    ::MapUntil<Js::ScriptContext::InternalClose()::__0>
              ((List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::FreeListedRemovePolicy,DefaultComparer>
                *)pLVar6,(anon_class_8_1_d76e401f)local_55);
    if ((local_55[0] & 1) != 0) {
      autoDebugContextCloseCS.cs = (CriticalSection *)this;
      MapFunction<Js::ScriptContext::InternalClose()::__1>
                (this,(anon_class_8_1_8991fb9c_for_mapper)this);
    }
  }
  AutoCriticalSection::~AutoCriticalSection(&local_48);
  pTVar4 = GetThreadContext(this);
  deadCode = GetSourceSize(this);
  ThreadContext::SubSourceSize(pTVar4,deadCode);
  if (this->interpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    InterpreterThunkEmitter::Close(this->interpreterThunkEmitter);
  }
  if (this->asmJsInterpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    InterpreterThunkEmitter::Close(this->asmJsInterpreterThunkEmitter);
  }
  if (this->m_remoteScriptContextAddr != (PSCRIPTCONTEXT_HANDLE)0x0) {
    this_00 = JITManager::GetJITManager();
    JITManager::CloseScriptContext(this_00,this->m_remoteScriptContextAddr);
  }
  EnsureClearDebugDocument(this);
  if (this->debugContext != (DebugContext *)0x0) {
    pPVar7 = DebugContext::GetProbeContainer(this->debugContext);
    if (pPVar7 != (ProbeContainer *)0x0) {
      pPVar7 = DebugContext::GetProbeContainer(this->debugContext);
      Js::ProbeContainer::UninstallInlineBreakpointProbe(pPVar7,(HaltCallback *)0x0);
      pPVar7 = DebugContext::GetProbeContainer(this->debugContext);
      Js::ProbeContainer::UninstallDebuggerScriptOptionCallback(pPVar7);
    }
    AutoCriticalSection::AutoCriticalSection(&local_70,&this->debugContextCloseCS);
    DebugContext::Close(this->debugContext);
    AutoCriticalSection::~AutoCriticalSection(&local_70);
  }
  if (this->diagnosticArena != (ArenaAllocator *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
              (&Memory::HeapAllocator::Instance,this->diagnosticArena);
    this->diagnosticArena = (ArenaAllocator *)0x0;
  }
  bVar3 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ProfileFlag);
  if (bVar3) {
    if ((this->isProfilerCreated & 1U) != 0) {
      ProfilePrint(this);
    }
    if (this->profiler != (ScriptContextProfiler *)0x0) {
      ScriptContextProfiler::Release(this->profiler);
      this->profiler = (ScriptContextProfiler *)0x0;
    }
  }
  if ((this->referencesSharedDynamicSourceContextInfo & 1U) != 0) {
    pDVar8 = GetDynamicSourceContextInfoMap(this);
    if (pDVar8 == (DynamicSourceContextInfoMap *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x310,"(this->GetDynamicSourceContextInfoMap() != nullptr)",
                                  "this->GetDynamicSourceContextInfoMap() != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pTVar4 = GetThreadContext(this);
    url = GetUrl(this);
    ThreadContext::ReleaseSourceDynamicProfileManagers(pTVar4,url);
  }
  if (this->interpreterArena != (ArenaAllocator *)0x0) {
    ReleaseInterpreterArena(this);
    this->interpreterArena = (ArenaAllocator *)0x0;
  }
  this->builtInLibraryFunctions = (BuiltInLibraryFunctionMap *)0x0;
  (this->super_ScriptContextBase).pActiveScriptDirect = (IActiveScriptDirect *)0x0;
  this->isWeakReferenceDictionaryListCleared = true;
  this_01 = &this->weakReferenceDictionaryList;
  pAVar9 = GeneralAllocator(this);
  ppSVar10 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&this_01->super_SListNodeBase<Memory::ArenaAllocator>);
  next = *ppSVar10;
  while (bVar3 = SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::
                 IsHead(this_01,next), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar10 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    pSVar1 = *ppSVar10;
    local_c0 = (code *)Memory::
                       TypeAllocatorFunc<Memory::ArenaAllocator,_JsUtil::IWeakReferenceDictionary_*>
                       ::GetFreeFunc();
    plVar11 = (long *)((long)&(pAVar9->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                              ).super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_c0 & 1) != 0) {
      local_c0 = *(code **)(local_c0 + *plVar11 + -1);
    }
    (*local_c0)(plVar11,next,0x10);
    next = pSVar1;
  }
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::Reset(this_01);
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Clear
            (&this->noSpecialPropertyRegistry,false);
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
            (&this->onlyWritablePropertyRegistry,false);
  ThreadContext::ReleaseDebugManager(this->threadContext);
  if ((this->super_ScriptContextBase).javascriptLibrary != (JavascriptLibrary *)0x0) {
    JavascriptLibrary::CleanupForClose((this->super_ScriptContextBase).javascriptLibrary);
    JavascriptLibrary::Uninitialize((this->super_ScriptContextBase).javascriptLibrary);
    ClearScriptContextCaches(this);
  }
  return;
}

Assistant:

void ScriptContext::InternalClose()
    {
        isScriptContextActuallyClosed = true;
        this->GetThreadContext()->closedScriptContextCount++;

        PERF_COUNTER_DEC(Basic, ScriptContextActive);

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: ScriptContext Close\n"));
            Output::Flush();
        }
#endif
        JS_ETW_INTERNAL(EventWriteJSCRIPT_HOST_SCRIPT_CONTEXT_CLOSE(this));

#if ENABLE_TTD
        if(this->TTDWellKnownInfo != nullptr)
        {
            TT_HEAP_DELETE(TTD::RuntimeContextInfo, this->TTDWellKnownInfo);
            this->TTDWellKnownInfo = nullptr;
        }

        if(this->TTDContextInfo != nullptr)
        {
            TT_HEAP_DELETE(TTD::ScriptContextTTD, this->TTDContextInfo);
            this->TTDContextInfo = nullptr;
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        if (nativeCodeGen != nullptr)
        {
            Assert(!isInitialized || this->globalObject != nullptr);
            CloseNativeCodeGenerator(this->nativeCodeGen);
        }
#endif
        {
            // Take lock on the function bodies to sync with the etw source rundown if any.
            AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());
            if (this->sourceList)
            {
                bool hasFunctions = false;
                this->sourceList->MapUntil([&hasFunctions](int, RecyclerWeakReference<Utf8SourceInfo>* sourceInfoWeakRef) -> bool
                {
                    Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();
                    if (sourceInfo)
                    {
                        hasFunctions = sourceInfo->HasFunctions();
                    }

                    return hasFunctions;
                });

                if (hasFunctions)
                {
#if ENABLE_NATIVE_CODEGEN
#if PDATA_ENABLED && defined(_WIN32)
                    struct AutoReset
                    {
                        AutoReset(ThreadContext* threadContext)
                            :threadContext(threadContext)
                        {
                            // indicate background thread that we need help to delete the xData
                            threadContext->GetJobProcessor()->StartExtraWork();
                        }
                        ~AutoReset()
                        {
                            threadContext->GetJobProcessor()->EndExtraWork();
                        }

                        ThreadContext* threadContext;
                    } autoReset(this->GetThreadContext());
#endif
#endif

                    // We still need to walk through all the function bodies and call cleanup
                    // because otherwise ETW events might not get fired if a GC doesn't happen
                    // and the thread context isn't shut down cleanly (process detach case)
                    this->MapFunction([this](Js::FunctionBody* functionBody) {
                        Assert(functionBody->GetScriptContext() == nullptr || functionBody->GetScriptContext() == this);
                        functionBody->Cleanup(/* isScriptContextClosing */ true);
                    });
                }
            }
        }

        this->GetThreadContext()->SubSourceSize(this->GetSourceSize());

#if DYNAMIC_INTERPRETER_THUNK
        if (this->interpreterThunkEmitter != nullptr)
        {
            this->interpreterThunkEmitter->Close();
        }
#endif

#ifdef ASMJS_PLAT
        if (this->asmJsInterpreterThunkEmitter != nullptr)
        {
            this->asmJsInterpreterThunkEmitter->Close();
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        if (m_remoteScriptContextAddr)
        {
            JITManager::GetJITManager()->CloseScriptContext(m_remoteScriptContextAddr);
        }
#endif

#ifdef ENABLE_SCRIPT_PROFILING
        // Stop profiling if present
        DeRegisterProfileProbe(S_OK, nullptr);
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
        this->EnsureClearDebugDocument();

        if (this->debugContext != nullptr)
        {
            if (this->debugContext->GetProbeContainer() != nullptr)
            {
                this->debugContext->GetProbeContainer()->UninstallInlineBreakpointProbe(nullptr);
                this->debugContext->GetProbeContainer()->UninstallDebuggerScriptOptionCallback();
            }

            // Guard the closing DebugContext as in meantime PDM might call OnBreakFlagChange
            AutoCriticalSection autoDebugContextCloseCS(&debugContextCloseCS);
            this->debugContext->Close();
            // Not deleting debugContext here as Close above will clear all memory debugContext allocated.
            // Actual deletion of debugContext will happen in ScriptContext destructor
        }

        if (this->diagnosticArena != nullptr)
        {
            HeapDelete(this->diagnosticArena);
            this->diagnosticArena = nullptr;
        }
#endif

        // Need to print this out before the native code gen is deleted
        // which will delete the codegenProfiler

#ifdef PROFILE_EXEC
        if (Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))
        {
            if (isProfilerCreated)
            {
                this->ProfilePrint();
            }

            if (profiler != nullptr)
            {
                profiler->Release();
                profiler = nullptr;
            }
        }
#endif


#if ENABLE_PROFILE_INFO
        // Release this only after native code gen is shut down, as there may be
        // profile info allocated from the SourceDynamicProfileManager arena.
        // The first condition might not be true if the dynamic functions have already been freed by the time
        // ScriptContext closes
        if (referencesSharedDynamicSourceContextInfo)
        {
            // For the host provided dynamic code, we may not have added any dynamic context to the dynamicSourceContextInfoMap
            Assert(this->GetDynamicSourceContextInfoMap() != nullptr);
            this->GetThreadContext()->ReleaseSourceDynamicProfileManagers(this->GetUrl());
        }
#endif

        RECYCLER_PERF_COUNTER_SUB(BindReference, bindReferenceCount);

        if (this->interpreterArena)
        {
            ReleaseInterpreterArena();
            interpreterArena = nullptr;
        }

        builtInLibraryFunctions = nullptr;

        pActiveScriptDirect = nullptr;

        isWeakReferenceDictionaryListCleared = true;
        this->weakReferenceDictionaryList.Clear(this->GeneralAllocator());

        this->noSpecialPropertyRegistry.Clear(false /* isThreadClear */);
        this->onlyWritablePropertyRegistry.Clear(false /* isThreadClear */);

#ifdef ENABLE_SCRIPT_DEBUGGING
        threadContext->ReleaseDebugManager();
#endif

        // This can be null if the script context initialization threw
        // and InternalClose gets called in the destructor code path
        if (javascriptLibrary != nullptr)
        {
            javascriptLibrary->CleanupForClose();
            javascriptLibrary->Uninitialize();

            this->ClearScriptContextCaches();
        }
    }